

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddStore
          (InstructionBuilder *this,uint32_t ptr_id,uint32_t obj_id)

{
  InstructionBuilder *this_00;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_b4;
  InstructionBuilder *local_b0;
  Operand local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_b4;
  local_b4 = ptr_id;
  local_b0 = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_a8.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_b4;
  local_b4 = obj_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
  local_a8.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_a8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  pIVar1 = (Instruction *)::operator_new(0x70);
  this_00 = local_b0;
  Instruction::Instruction(pIVar1,local_b0->context_,OpStore,0,0,&operands);
  local_a8._0_8_ = pIVar1;
  pIVar1 = AddInstruction(this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   *)&local_a8);
  if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a8._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar1;
}

Assistant:

Instruction* AddStore(uint32_t ptr_id, uint32_t obj_id) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {ptr_id}});
    operands.push_back({SPV_OPERAND_TYPE_ID, {obj_id}});

    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpStore, 0, 0, operands));
    return AddInstruction(std::move(new_inst));
  }